

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddBinaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1,uint32_t operand2)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  IRContext *pIVar1;
  Instruction *pIVar2;
  Operand *local_170;
  uint32_t local_164;
  allocator<spvtools::opt::Operand> local_13d;
  uint32_t local_13c;
  iterator local_138;
  undefined8 local_130;
  SmallVector<unsigned_int,_2UL> local_128;
  uint32_t local_fc;
  iterator local_f8;
  undefined8 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  Operand local_c0;
  Operand OStack_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newBinOp;
  uint32_t result_id;
  uint32_t operand2_local;
  uint32_t operand1_local;
  Op opcode_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  newBinOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 0;
  if (type_id != 0) {
    pIVar1 = GetContext(this);
    newBinOp._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         IRContext::TakeNextId(pIVar1);
    if (newBinOp._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
      return (Instruction *)0x0;
    }
  }
  pIVar2 = (Instruction *)::operator_new(0x70);
  pIVar1 = GetContext(this);
  if (opcode == OpStore) {
    local_164 = 0;
  }
  else {
    local_164 = newBinOp._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  }
  local_f8 = &local_fc;
  local_f0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_f8;
  local_fc = operand1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list_00);
  Operand::Operand(&local_c0,SPV_OPERAND_TYPE_ID,&local_e8);
  local_138 = &local_13c;
  local_130 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_138;
  local_13c = operand2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list);
  Operand::Operand(&OStack_90,SPV_OPERAND_TYPE_ID,&local_128);
  local_60 = &local_c0;
  local_58 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator(&local_13d);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_13d);
  opt::Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,local_164,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,pIVar2);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_13d);
  local_170 = (Operand *)&local_60;
  do {
    local_170 = local_170 + -1;
    Operand::~Operand(local_170);
  } while (local_170 != &local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
  pIVar2 = AddInstruction(this,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  return pIVar2;
}

Assistant:

Instruction* AddBinaryOp(uint32_t type_id, spv::Op opcode, uint32_t operand1,
                           uint32_t operand2) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newBinOp(new Instruction(
        GetContext(), opcode, type_id,
        opcode == spv::Op::OpStore ? 0 : result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand2}}}));
    return AddInstruction(std::move(newBinOp));
  }